

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_array.c
# Opt level: O0

int canvas_istable(_glist *x)

{
  t_symbol *ptVar1;
  t_symbol *ptVar2;
  bool local_2d;
  int local_2c;
  t_atom *local_28;
  int istable;
  int argc;
  t_atom *argv;
  _glist *x_local;
  
  if ((x->gl_obj).te_binbuf == (_binbuf *)0x0) {
    local_28 = (t_atom *)0x0;
  }
  else {
    local_28 = binbuf_getvec((x->gl_obj).te_binbuf);
  }
  if ((x->gl_obj).te_binbuf == (_binbuf *)0x0) {
    local_2c = 0;
  }
  else {
    local_2c = binbuf_getnatom((x->gl_obj).te_binbuf);
  }
  local_2d = false;
  if ((local_2c != 0) && (local_2d = false, local_28->a_type == A_SYMBOL)) {
    ptVar1 = (local_28->a_w).w_symbol;
    ptVar2 = gensym("table");
    local_2d = ptVar1 == ptVar2;
  }
  return (uint)local_2d;
}

Assistant:

int canvas_istable(const t_canvas *x)
{
    t_atom *argv = (x->gl_obj.te_binbuf? binbuf_getvec(x->gl_obj.te_binbuf):0);
    int argc = (x->gl_obj.te_binbuf? binbuf_getnatom(x->gl_obj.te_binbuf) : 0);
    int istable = (argc && argv[0].a_type == A_SYMBOL &&
        argv[0].a_w.w_symbol == gensym("table"));
    return (istable);
}